

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_std.cc
# Opt level: O3

int main(void)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [11];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  ostream *poVar19;
  uint uVar20;
  Person *p;
  long lVar21;
  slot_type *psVar22;
  char *pcVar23;
  undefined1 *puVar24;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  flat_hash_set<Person,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  persons;
  allocator_type local_13b;
  key_equal local_13a;
  hasher local_139;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  local_138;
  undefined1 local_108 [32];
  _Alloc_hider local_e8;
  char local_d8 [16];
  int local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined4 local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined4 local_38;
  
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"John","");
  local_e8._M_p = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Mitchell","");
  local_c8 = 0x23;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Jane","");
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Smith","");
  local_80 = 0x20;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Jane","");
  puVar24 = local_48;
  local_58[0] = puVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Smith","");
  local_38 = 0x1e;
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,phmap::Hash<Person>,phmap::EqualTo<Person>,std::allocator<Person>>
  ::raw_hash_set<Person_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,phmap::Hash<Person>,phmap::EqualTo<Person>,std::allocator<Person>>
              *)&local_138,(Person *)local_108,(Person *)&stack0xffffffffffffffd0,0,&local_139,
             &local_13a,&local_13b);
  lVar21 = -0xd8;
  do {
    if (puVar24 != *(undefined1 **)(puVar24 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar24 + -0x10));
    }
    if (puVar24 + -0x20 != *(undefined1 **)(puVar24 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar24 + -0x30));
    }
    puVar24 = puVar24 + -0x48;
    lVar21 = lVar21 + 0x48;
  } while (lVar21 != 0);
  cVar1 = *local_138.ctrl_;
  pcVar23 = local_138.ctrl_;
  psVar22 = local_138.slots_;
  while (cVar1 < -1) {
    iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                   CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                   CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar23 < (char)iVar7);
    in_XMM1_Bb = -(pcVar23[1] < (char)((uint)iVar7 >> 8));
    in_XMM1_Bc = -(pcVar23[2] < (char)((uint)iVar7 >> 0x10));
    in_XMM1_Bd = -(pcVar23[3] < (char)((uint)iVar7 >> 0x18));
    in_XMM1_Be = -(pcVar23[4] < (char)iVar8);
    in_XMM1_Bf = -(pcVar23[5] < (char)((uint)iVar8 >> 8));
    in_XMM1_Bg = -(pcVar23[6] < (char)((uint)iVar8 >> 0x10));
    in_XMM1_Bh = -(pcVar23[7] < (char)((uint)iVar8 >> 0x18));
    in_XMM1_Bi = -(pcVar23[8] < (char)iVar9);
    in_XMM1_Bj = -(pcVar23[9] < (char)((uint)iVar9 >> 8));
    in_XMM1_Bk = -(pcVar23[10] < (char)((uint)iVar9 >> 0x10));
    in_XMM1_Bl = -(pcVar23[0xb] < (char)((uint)iVar9 >> 0x18));
    in_XMM1_Bm = -(pcVar23[0xc] < (char)iVar10);
    in_XMM1_Bn = -(pcVar23[0xd] < (char)((uint)iVar10 >> 8));
    in_XMM1_Bo = -(pcVar23[0xe] < (char)((uint)iVar10 >> 0x10));
    in_XMM1_Bp = -(pcVar23[0xf] < (char)((uint)iVar10 >> 0x18));
    auVar3[1] = in_XMM1_Bb;
    auVar3[0] = in_XMM1_Ba;
    auVar3[2] = in_XMM1_Bc;
    auVar3[3] = in_XMM1_Bd;
    auVar3[4] = in_XMM1_Be;
    auVar3[5] = in_XMM1_Bf;
    auVar3[6] = in_XMM1_Bg;
    auVar3[7] = in_XMM1_Bh;
    auVar3[8] = in_XMM1_Bi;
    auVar3[9] = in_XMM1_Bj;
    auVar3[10] = in_XMM1_Bk;
    auVar3[0xb] = in_XMM1_Bl;
    auVar3[0xc] = in_XMM1_Bm;
    auVar3[0xd] = in_XMM1_Bn;
    auVar3[0xe] = in_XMM1_Bo;
    auVar3[0xf] = in_XMM1_Bp;
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar17[1] = in_XMM1_Bd;
    auVar17[0] = in_XMM1_Bc;
    auVar17[2] = in_XMM1_Be;
    auVar17[3] = in_XMM1_Bf;
    auVar17[4] = in_XMM1_Bg;
    auVar17[5] = in_XMM1_Bh;
    auVar17[6] = in_XMM1_Bi;
    auVar17[7] = in_XMM1_Bj;
    auVar17[8] = in_XMM1_Bk;
    auVar17[9] = in_XMM1_Bl;
    auVar17[10] = in_XMM1_Bm;
    auVar17[0xb] = in_XMM1_Bn;
    auVar17[0xc] = in_XMM1_Bo;
    auVar17[0xd] = in_XMM1_Bp;
    auVar15[1] = in_XMM1_Be;
    auVar15[0] = in_XMM1_Bd;
    auVar15[2] = in_XMM1_Bf;
    auVar15[3] = in_XMM1_Bg;
    auVar15[4] = in_XMM1_Bh;
    auVar15[5] = in_XMM1_Bi;
    auVar15[6] = in_XMM1_Bj;
    auVar15[7] = in_XMM1_Bk;
    auVar15[8] = in_XMM1_Bl;
    auVar15[9] = in_XMM1_Bm;
    auVar15[10] = in_XMM1_Bn;
    auVar15[0xb] = in_XMM1_Bo;
    auVar15[0xc] = in_XMM1_Bp;
    auVar13[1] = in_XMM1_Bf;
    auVar13[0] = in_XMM1_Be;
    auVar13[2] = in_XMM1_Bg;
    auVar13[3] = in_XMM1_Bh;
    auVar13[4] = in_XMM1_Bi;
    auVar13[5] = in_XMM1_Bj;
    auVar13[6] = in_XMM1_Bk;
    auVar13[7] = in_XMM1_Bl;
    auVar13[8] = in_XMM1_Bm;
    auVar13[9] = in_XMM1_Bn;
    auVar13[10] = in_XMM1_Bo;
    auVar13[0xb] = in_XMM1_Bp;
    auVar11[1] = in_XMM1_Bg;
    auVar11[0] = in_XMM1_Bf;
    auVar11[2] = in_XMM1_Bh;
    auVar11[3] = in_XMM1_Bi;
    auVar11[4] = in_XMM1_Bj;
    auVar11[5] = in_XMM1_Bk;
    auVar11[6] = in_XMM1_Bl;
    auVar11[7] = in_XMM1_Bm;
    auVar11[8] = in_XMM1_Bn;
    auVar11[9] = in_XMM1_Bo;
    auVar11[10] = in_XMM1_Bp;
    uVar20 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar13 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar2 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    psVar22 = psVar22 + uVar2;
    cVar1 = pcVar23[uVar2];
    pcVar23 = pcVar23 + uVar2;
  }
  if (pcVar23 != local_138.ctrl_ + local_138.capacity_) {
    do {
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(psVar22->_first)._M_dataplus._M_p,
                           (psVar22->_first)._M_string_length);
      local_108[0] = (string)0x20;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_108,1);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(psVar22->_last)._M_dataplus._M_p,
                           (psVar22->_last)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," (",2);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,psVar22->_age);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
      local_108[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_108,1);
      psVar22 = psVar22 + 1;
      cVar1 = pcVar23[1];
      pcVar23 = pcVar23 + 1;
      while (cVar1 < -1) {
        iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar23 < (char)iVar7);
        in_XMM1_Bb = -(pcVar23[1] < (char)((uint)iVar7 >> 8));
        in_XMM1_Bc = -(pcVar23[2] < (char)((uint)iVar7 >> 0x10));
        in_XMM1_Bd = -(pcVar23[3] < (char)((uint)iVar7 >> 0x18));
        in_XMM1_Be = -(pcVar23[4] < (char)iVar8);
        in_XMM1_Bf = -(pcVar23[5] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bg = -(pcVar23[6] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bh = -(pcVar23[7] < (char)((uint)iVar8 >> 0x18));
        in_XMM1_Bi = -(pcVar23[8] < (char)iVar9);
        in_XMM1_Bj = -(pcVar23[9] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bk = -(pcVar23[10] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bl = -(pcVar23[0xb] < (char)((uint)iVar9 >> 0x18));
        in_XMM1_Bm = -(pcVar23[0xc] < (char)iVar10);
        in_XMM1_Bn = -(pcVar23[0xd] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bo = -(pcVar23[0xe] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bp = -(pcVar23[0xf] < (char)((uint)iVar10 >> 0x18));
        auVar5[1] = in_XMM1_Bb;
        auVar5[0] = in_XMM1_Ba;
        auVar5[2] = in_XMM1_Bc;
        auVar5[3] = in_XMM1_Bd;
        auVar5[4] = in_XMM1_Be;
        auVar5[5] = in_XMM1_Bf;
        auVar5[6] = in_XMM1_Bg;
        auVar5[7] = in_XMM1_Bh;
        auVar5[8] = in_XMM1_Bi;
        auVar5[9] = in_XMM1_Bj;
        auVar5[10] = in_XMM1_Bk;
        auVar5[0xb] = in_XMM1_Bl;
        auVar5[0xc] = in_XMM1_Bm;
        auVar5[0xd] = in_XMM1_Bn;
        auVar5[0xe] = in_XMM1_Bo;
        auVar5[0xf] = in_XMM1_Bp;
        auVar6[1] = in_XMM1_Bb;
        auVar6[0] = in_XMM1_Ba;
        auVar6[2] = in_XMM1_Bc;
        auVar6[3] = in_XMM1_Bd;
        auVar6[4] = in_XMM1_Be;
        auVar6[5] = in_XMM1_Bf;
        auVar6[6] = in_XMM1_Bg;
        auVar6[7] = in_XMM1_Bh;
        auVar6[8] = in_XMM1_Bi;
        auVar6[9] = in_XMM1_Bj;
        auVar6[10] = in_XMM1_Bk;
        auVar6[0xb] = in_XMM1_Bl;
        auVar6[0xc] = in_XMM1_Bm;
        auVar6[0xd] = in_XMM1_Bn;
        auVar6[0xe] = in_XMM1_Bo;
        auVar6[0xf] = in_XMM1_Bp;
        auVar18[1] = in_XMM1_Bd;
        auVar18[0] = in_XMM1_Bc;
        auVar18[2] = in_XMM1_Be;
        auVar18[3] = in_XMM1_Bf;
        auVar18[4] = in_XMM1_Bg;
        auVar18[5] = in_XMM1_Bh;
        auVar18[6] = in_XMM1_Bi;
        auVar18[7] = in_XMM1_Bj;
        auVar18[8] = in_XMM1_Bk;
        auVar18[9] = in_XMM1_Bl;
        auVar18[10] = in_XMM1_Bm;
        auVar18[0xb] = in_XMM1_Bn;
        auVar18[0xc] = in_XMM1_Bo;
        auVar18[0xd] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Be;
        auVar16[0] = in_XMM1_Bd;
        auVar16[2] = in_XMM1_Bf;
        auVar16[3] = in_XMM1_Bg;
        auVar16[4] = in_XMM1_Bh;
        auVar16[5] = in_XMM1_Bi;
        auVar16[6] = in_XMM1_Bj;
        auVar16[7] = in_XMM1_Bk;
        auVar16[8] = in_XMM1_Bl;
        auVar16[9] = in_XMM1_Bm;
        auVar16[10] = in_XMM1_Bn;
        auVar16[0xb] = in_XMM1_Bo;
        auVar16[0xc] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bf;
        auVar14[0] = in_XMM1_Be;
        auVar14[2] = in_XMM1_Bg;
        auVar14[3] = in_XMM1_Bh;
        auVar14[4] = in_XMM1_Bi;
        auVar14[5] = in_XMM1_Bj;
        auVar14[6] = in_XMM1_Bk;
        auVar14[7] = in_XMM1_Bl;
        auVar14[8] = in_XMM1_Bm;
        auVar14[9] = in_XMM1_Bn;
        auVar14[10] = in_XMM1_Bo;
        auVar14[0xb] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bg;
        auVar12[0] = in_XMM1_Bf;
        auVar12[2] = in_XMM1_Bh;
        auVar12[3] = in_XMM1_Bi;
        auVar12[4] = in_XMM1_Bj;
        auVar12[5] = in_XMM1_Bk;
        auVar12[6] = in_XMM1_Bl;
        auVar12[7] = in_XMM1_Bm;
        auVar12[8] = in_XMM1_Bn;
        auVar12[9] = in_XMM1_Bo;
        auVar12[10] = in_XMM1_Bp;
        uVar20 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar2 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        psVar22 = psVar22 + uVar2;
        cVar1 = pcVar23[uVar2];
        pcVar23 = pcVar23 + uVar2;
      }
    } while (pcVar23 != local_138.ctrl_ + local_138.capacity_);
  }
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  ::destroy_slots(&local_138);
  return 0;
}

Assistant:

int main()
{
    // As we have defined a specialization of std::hash() for Person,
    // we can now create sparse_hash_set or sparse_hash_map of Persons
    // ----------------------------------------------------------------
    phmap::flat_hash_set<Person> persons = 
        { { "John", "Mitchell", 35 },
          { "Jane", "Smith",    32 },
          { "Jane", "Smith",    30 },
        };

    for (auto& p: persons)
        std::cout << p._first << ' ' << p._last << " (" << p._age << ")" << '\n';

}